

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

bool __thiscall
ON_3dVector::PerpendicularTo(ON_3dVector *this,ON_3dPoint *P0,ON_3dPoint *P1,ON_3dPoint *P2)

{
  bool bVar1;
  ON_3dVector *pOVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ON_3dVector V0;
  ON_3dVector V2;
  ON_3dVector V1;
  ON_3dVector N2;
  ON_3dVector N1;
  ON_3dVector N0;
  ON_3dVector local_e0;
  ON_3dVector local_c8;
  ON_3dVector local_b0;
  double local_98;
  double local_90;
  ON_3dVector local_70;
  ON_3dVector local_58;
  ON_3dVector local_40;
  
  this->z = ZeroVector.z;
  dVar3 = ZeroVector.y;
  this->x = ZeroVector.x;
  this->y = dVar3;
  ON_3dVector(&local_e0,P2->x - P1->x,P2->y - P1->y,P2->z - P1->z);
  ON_3dVector(&local_b0,P0->x - P2->x,P0->y - P2->y,P0->z - P2->z);
  ON_3dVector(&local_c8,P1->x - P0->x,P1->y - P0->y,P1->z - P0->z);
  ON_3dVector(&local_40,local_b0.y * local_c8.z - local_b0.z * local_c8.y,
              local_b0.z * local_c8.x - local_c8.z * local_b0.x,
              local_b0.x * local_c8.y - local_b0.y * local_c8.x);
  bVar1 = Unitize(&local_40);
  if (bVar1) {
    ON_3dVector(&local_58,local_c8.y * local_e0.z - local_c8.z * local_e0.y,
                local_c8.z * local_e0.x - local_e0.z * local_c8.x,
                local_c8.x * local_e0.y - local_c8.y * local_e0.x);
    bVar1 = Unitize(&local_58);
    if (bVar1) {
      ON_3dVector(&local_70,local_e0.y * local_b0.z - local_e0.z * local_b0.y,
                  local_e0.z * local_b0.x - local_b0.z * local_e0.x,
                  local_e0.x * local_b0.y - local_e0.y * local_b0.x);
      bVar1 = Unitize(&local_70);
      if (!bVar1) {
        return bVar1;
      }
      local_90 = ON_Length3d(local_e0.x,local_e0.y,local_e0.z);
      local_90 = 1.0 / local_90;
      local_98 = ON_Length3d(local_b0.x,local_b0.y,local_b0.z);
      local_98 = 1.0 / local_98;
      dVar3 = ON_Length3d(local_c8.x,local_c8.y,local_c8.z);
      dVar3 = 1.0 / dVar3;
      dVar4 = ABS(local_40.z * local_c8.z + local_40.x * local_c8.x + local_40.y * local_c8.y) *
              dVar3 + ABS(local_40.z * local_e0.z +
                          local_40.x * local_e0.x + local_40.y * local_e0.y) * local_90 +
                      ABS(local_40.z * local_b0.z +
                          local_40.x * local_b0.x + local_40.y * local_b0.y) * local_98;
      dVar5 = ABS(local_58.z * local_c8.z + local_58.x * local_c8.x + local_58.y * local_c8.y) *
              dVar3 + ABS(local_58.z * local_e0.z +
                          local_58.x * local_e0.x + local_e0.y * local_58.y) * local_90 +
                      ABS(local_58.z * local_b0.z +
                          local_58.x * local_b0.x + local_b0.y * local_58.y) * local_98;
      pOVar2 = &local_40;
      if (dVar5 < dVar4) {
        pOVar2 = &local_58;
      }
      if (ABS(local_70.z * local_c8.z + local_70.x * local_c8.x + local_c8.y * local_70.y) * dVar3 +
          ABS(local_e0.z * local_70.z + local_e0.x * local_70.x + local_e0.y * local_70.y) *
          local_90 +
          ABS(local_b0.z * local_70.z + local_b0.x * local_70.x + local_b0.y * local_70.y) *
          local_98 <
          (double)(~-(ulong)(dVar5 < dVar4) & (ulong)dVar4 | (ulong)dVar5 & -(ulong)(dVar5 < dVar4))
         ) {
        pOVar2 = &local_70;
      }
      this->z = pOVar2->z;
      dVar3 = pOVar2->y;
      this->x = pOVar2->x;
      this->y = dVar3;
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool
ON_3dVector::PerpendicularTo( 
      const ON_3dPoint& P0, const ON_3dPoint& P1, const ON_3dPoint& P2
      )
{
  // Find a the unit normal to a triangle defined by 3 points
  *this = ON_3dVector::ZeroVector;

  ON_3dVector V0 = P2 - P1;
  ON_3dVector V1 = P0 - P2;
  ON_3dVector V2 = P1 - P0;

  ON_3dVector N0 = ON_CrossProduct( V1, V2 );
  if ( !N0.Unitize() )
    return false;
  ON_3dVector N1 = ON_CrossProduct( V2, V0 );
  if ( !N1.Unitize() )
    return false;
  ON_3dVector N2 = ON_CrossProduct( V0, V1 );
  if ( !N2.Unitize() )
    return false;

  const double s0 = 1.0/V0.Length();
  const double s1 = 1.0/V1.Length();
  const double s2 = 1.0/V2.Length();

  // choose normal with smallest total error
  const double e0 = s0*fabs(ON_DotProduct(N0,V0)) + s1*fabs(ON_DotProduct(N0,V1)) + s2*fabs(ON_DotProduct(N0,V2));
  const double e1 = s0*fabs(ON_DotProduct(N1,V0)) + s1*fabs(ON_DotProduct(N1,V1)) + s2*fabs(ON_DotProduct(N1,V2));
  const double e2 = s0*fabs(ON_DotProduct(N2,V0)) + s1*fabs(ON_DotProduct(N2,V1)) + s2*fabs(ON_DotProduct(N2,V2));

  if ( e0 <= e1 ) {
    if ( e0 <= e2 ) {
      *this = N0;
    }
    else {
      *this = N2;
    }
  }
  else if (e1 <= e2) {
    *this = N1;
  }
  else {
    *this = N2;
  }
  
  return true;
}